

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetCurrentViewport(ImGuiWindow *current_window,ImGuiViewportP *viewport)

{
  _func_void_ImGuiViewport_ptr *UNRECOVERED_JUMPTABLE;
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (viewport == (ImGuiViewportP *)0x0) {
    if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
      GImGui->CurrentDpiScale = 1.0;
      pIVar1->CurrentViewport = (ImGuiViewportP *)0x0;
    }
  }
  else {
    viewport->LastFrameActive = GImGui->FrameCount;
    if (pIVar1->CurrentViewport != viewport) {
      pIVar1->CurrentDpiScale = (viewport->super_ImGuiViewport).DpiScale;
      pIVar1->CurrentViewport = viewport;
      UNRECOVERED_JUMPTABLE = (pIVar1->PlatformIO).Platform_OnChangedViewport;
      if (UNRECOVERED_JUMPTABLE != (_func_void_ImGuiViewport_ptr *)0x0) {
        (*UNRECOVERED_JUMPTABLE)(&viewport->super_ImGuiViewport);
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::SetCurrentViewport(ImGuiWindow* current_window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    (void)current_window;

    if (viewport)
        viewport->LastFrameActive = g.FrameCount;
    if (g.CurrentViewport == viewport)
        return;
    g.CurrentDpiScale = viewport ? viewport->DpiScale : 1.0f;
    g.CurrentViewport = viewport;
    //IMGUI_DEBUG_LOG_VIEWPORT("SetCurrentViewport changed '%s' 0x%08X\n", current_window ? current_window->Name : NULL, viewport ? viewport->ID : 0);

    // Notify platform layer of viewport changes
    // FIXME-DPI: This is only currently used for experimenting with handling of multiple DPI
    if (g.CurrentViewport && g.PlatformIO.Platform_OnChangedViewport)
        g.PlatformIO.Platform_OnChangedViewport(g.CurrentViewport);
}